

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  pointer pcVar1;
  pointer pbVar2;
  string *psVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer cc;
  pointer pbVar6;
  char *pcVar7;
  int local_3d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string fname;
  string local_340;
  cmCustomCommandGenerator ccg;
  cmGeneratedFileStream f;
  
  cc = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccv->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_3d4 = 0;
  for (; cc != pcVar1; cc = cc + 1) {
    std::__cxx11::string::string((string *)&local_340,(string *)&this->ConfigName);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              (&ccg,cc,&local_340,&this->LocalGenerator->super_cmLocalGenerator);
    std::__cxx11::string::~string((string *)&local_340);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    std::__cxx11::string::string((string *)&fname,(string *)psVar3);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
              (&local_3a0,this->LocalGenerator,this->GeneratorTarget);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,"/",
                   &local_3a0);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::operator+(&local_380,"/",&this->Name);
    std::operator+(&local_3a0,&local_380,"_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &local_3a0,name);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::to_string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,local_3d4);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::append((char *)&fname);
    cmGeneratedFileStream::cmGeneratedFileStream(&f,&fname,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&f,true);
    WriteCustomCommandsHelper(this,(ostream *)&f,&ccg);
    cmGeneratedFileStream::Close(&f);
    if (this->TagType == CUSTOM_TARGET) {
      poVar4 = std::operator<<(fout,(string *)&fname);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(fout,"    :outputName=\"");
      poVar4 = std::operator<<(poVar4,(string *)&fname);
      pcVar7 = ".rule\"";
    }
    else {
      poVar4 = std::operator<<(fout,"    :");
      poVar4 = std::operator<<(poVar4,(string *)cmd);
      poVar4 = std::operator<<(poVar4,"=\"");
      poVar4 = std::operator<<(poVar4,(string *)&fname);
      pcVar7 = "\"";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    pvVar5 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
    local_3d4 = local_3d4 + 1;
    pbVar2 = (pvVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      poVar4 = std::operator<<(fout,"    :extraOutputFile=\"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      poVar4 = std::operator<<(poVar4,"\"");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&f);
    std::__cxx11::string::~string((string *)&fname);
    cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname = this->LocalGenerator->GetCurrentBinaryDirectory();
    fname +=
      "/" + this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
    fname += "/" + this->Name + "_" + name;
    fname += std::to_string(cmdcount++);
    fname += this->CmdWindowsShell ? ".bat" : ".sh";
    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << fname << "\"" << std::endl;
    } else {
      fout << fname << std::endl;
      fout << "    :outputName=\"" << fname << ".rule\"" << std::endl;
    }
    for (auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"" << std::endl;
    }
  }
}